

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode,
          bool testOkToFail)

{
  bool bVar1;
  ulong uVar2;
  element_type *peVar3;
  _anonymous_namespace_ *this_00;
  allocator<char> local_339;
  string local_338;
  __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_318;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *childNode;
  const_iterator __end1;
  const_iterator __begin1;
  ChildSections *__range1;
  allocator<char> local_2d1;
  string local_2d0 [32];
  undefined1 local_2b0 [16];
  string local_2a0;
  allocator<char> local_279;
  string local_278 [32];
  undefined1 local_258 [24];
  string local_240;
  allocator<char> local_219;
  string local_218 [32];
  undefined1 local_1f8 [24];
  string local_1e0;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  ScopedElement e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string name;
  bool testOkToFail_local;
  SectionNode *sectionNode_local;
  string *rootName_local;
  string *className_local;
  JunitReporter *this_local;
  
  name.field_2._M_local_buf[0xf] = testOkToFail;
  trim((string *)local_50,&(sectionNode->stats).sectionInfo.name);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+(&local_90,rootName,'/');
    std::operator+(&local_70,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::__cxx11::string::operator=((string *)local_50,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  bVar1 = clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::empty
                    (&sectionNode->assertions);
  if (((!bVar1) || (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) ||
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d0,"testcase",&local_d1);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_b0,(string *)&this->xml,(XmlFormatting)local_d0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"classname",&local_149);
      XmlWriter::writeAttribute(&this->xml,&local_148,className);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"name",&local_171);
      XmlWriter::writeAttribute(&this->xml,&local_170,(string *)local_50);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"classname",&local_f9);
      XmlWriter::writeAttribute(&this->xml,&local_f8,(string *)local_50);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator(&local_f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"name",&local_121);
      XmlWriter::writeAttribute<char[5]>(&this->xml,&local_120,(char (*) [5])"root");
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator(&local_121);
    }
    std::allocator<char>::allocator();
    this_00 = (_anonymous_namespace_ *)0x1dc59b;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"time",&local_199);
    (anonymous_namespace)::formatDuration_abi_cxx11_
              (&local_1c0,this_00,(sectionNode->stats).durationInSeconds);
    XmlWriter::writeAttribute(&this->xml,&local_198,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"status",(allocator<char> *)(local_1f8 + 0x17));
    XmlWriter::writeAttribute<char[4]>(&this->xml,&local_1e0,(char (*) [4])0x1dc258);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)(local_1f8 + 0x17));
    if ((sectionNode->stats).assertions.failedButOk != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_218,"skipped",&local_219);
      operator|(Newline,Indent);
      XmlWriter::scopedElement((XmlWriter *)local_1f8,(string *)&this->xml,(XmlFormatting)local_218)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,"message",(allocator<char> *)(local_258 + 0x17));
      XmlWriter::ScopedElement::writeAttribute<char[31]>
                ((ScopedElement *)local_1f8,&local_240,
                 (char (*) [31])"TEST_CASE tagged with !mayfail");
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator((allocator<char> *)(local_258 + 0x17));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1f8);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator(&local_219);
    }
    writeAssertions(this,sectionNode);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_278,"system-out",&local_279);
      operator|(Newline,Indent);
      XmlWriter::scopedElement((XmlWriter *)local_258,(string *)&this->xml,(XmlFormatting)local_278)
      ;
      trim((string *)(local_2b0 + 0x10),&sectionNode->stdOut);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)local_258,(string *)(local_2b0 + 0x10),Newline);
      std::__cxx11::string::~string((string *)(local_2b0 + 0x10));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_258);
      std::__cxx11::string::~string(local_278);
      std::allocator<char>::~allocator(&local_279);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2d0,"system-err",&local_2d1);
      operator|(Newline,Indent);
      XmlWriter::scopedElement((XmlWriter *)local_2b0,(string *)&this->xml,(XmlFormatting)local_2d0)
      ;
      trim((string *)&__range1,&sectionNode->stdErr);
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_2b0,(string *)&__range1,Newline);
      std::__cxx11::string::~string((string *)&__range1);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_2b0);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator(&local_2d1);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_b0);
  }
  __end1 = clara::std::
           vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
           ::begin(&sectionNode->childSections);
  childNode = (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
              clara::std::
              vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
              ::end(&sectionNode->childSections);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                                     *)&childNode), bVar1) {
    local_318 = (__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                   ::operator*(&__end1);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      peVar3 = clara::std::
               __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(local_318);
      writeSection(this,className,(string *)local_50,peVar3,
                   (bool)(name.field_2._M_local_buf[0xf] & 1));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"",&local_339);
      peVar3 = clara::std::
               __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(local_318);
      writeSection(this,(string *)local_50,&local_338,peVar3,
                   (bool)(name.field_2._M_local_buf[0xf] & 1));
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator(&local_339);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void JunitReporter::writeSection( std::string const& className,
                                      std::string const& rootName,
                                      SectionNode const& sectionNode,
                                      bool testOkToFail) {
        std::string name = trim( sectionNode.stats.sectionInfo.name );
        if( !rootName.empty() )
            name = rootName + '/' + name;

        if( !sectionNode.assertions.empty() ||
            !sectionNode.stdOut.empty() ||
            !sectionNode.stdErr.empty() ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
            if( className.empty() ) {
                xml.writeAttribute( "classname", name );
                xml.writeAttribute( "name", "root" );
            }
            else {
                xml.writeAttribute( "classname", className );
                xml.writeAttribute( "name", name );
            }
            xml.writeAttribute( "time", formatDuration( sectionNode.stats.durationInSeconds ) );
            // This is not ideal, but it should be enough to mimic gtest's
            // junit output.
            // Ideally the JUnit reporter would also handle `skipTest`
            // events and write those out appropriately.
            xml.writeAttribute( "status", "run" );

            if (sectionNode.stats.assertions.failedButOk) {
                xml.scopedElement("skipped")
                    .writeAttribute("message", "TEST_CASE tagged with !mayfail");
            }

            writeAssertions( sectionNode );

            if( !sectionNode.stdOut.empty() )
                xml.scopedElement( "system-out" ).writeText( trim( sectionNode.stdOut ), XmlFormatting::Newline );
            if( !sectionNode.stdErr.empty() )
                xml.scopedElement( "system-err" ).writeText( trim( sectionNode.stdErr ), XmlFormatting::Newline );
        }
        for( auto const& childNode : sectionNode.childSections )
            if( className.empty() )
                writeSection( name, "", *childNode, testOkToFail );
            else
                writeSection( className, name, *childNode, testOkToFail );
    }